

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDsd.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkSparsifyInternal(Abc_Ntk_t *pNtk,int nPerc,int fVerbose)

{
  DdManager *dd;
  Abc_Obj_t *pObj;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  Abc_Ntk_t *pNtkNew;
  char *pcVar4;
  Vec_Ptr_t *pVVar5;
  DdNode *n;
  Abc_Obj_t *pAVar6;
  int nFanins;
  char *pSuffix;
  long lVar7;
  long lVar8;
  DdNode *bFunc;
  ulong uVar9;
  Abc_Obj_t *pAVar10;
  
  pNtkNew = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_BDD,1);
  pVVar5 = pNtk->vCis;
  if (0 < pVVar5->nSize) {
    lVar7 = 0;
    do {
      Abc_NtkDupObj(pNtkNew,(Abc_Obj_t *)pVVar5->pArray[lVar7],1);
      lVar7 = lVar7 + 1;
      pVVar5 = pNtk->vCis;
    } while (lVar7 < pVVar5->nSize);
  }
  pcVar4 = Extra_UtilStrsav(pNtk->pName);
  pNtkNew->pName = pcVar4;
  pcVar4 = Extra_UtilStrsav(pNtk->pSpec);
  pNtkNew->pSpec = pcVar4;
  dd = (DdManager *)pNtkNew->pManFunc;
  Cudd_bddIthVar(dd,pNtk->vCis->nSize + -1);
  pVVar5 = pNtk->vCos;
  if (0 < pVVar5->nSize) {
    lVar7 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar5->pArray[lVar7];
      pAVar10 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
      uVar3 = *(uint *)&pAVar10->field_0x14 & 0xf;
      if ((uVar3 == 5) || (uVar3 == 2)) {
        Abc_NtkDupObj(pNtkNew,pObj,0);
        Abc_ObjAddFanin((pObj->field_6).pCopy,
                        (Abc_Obj_t *)
                        ((ulong)(*(uint *)&pObj->field_0x14 >> 10 & 1) ^
                        (ulong)(pAVar10->field_6).pTemp));
        pAVar6 = (pObj->field_6).pCopy;
        pcVar4 = Abc_ObjName(pObj);
        Abc_ObjAssignName(pAVar6,pcVar4,"_on");
        Abc_NtkDupObj(pNtkNew,pObj,0);
        pAVar6 = (pObj->field_6).pCopy;
        pAVar10 = (Abc_Obj_t *)
                  ((ulong)((*(uint *)&pObj->field_0x14 >> 10 & 1) == 0) ^
                  (ulong)(pAVar10->field_6).pTemp);
LAB_002547a0:
        Abc_ObjAddFanin(pAVar6,pAVar10);
        pAVar10 = (pObj->field_6).pCopy;
        pcVar4 = Abc_ObjName(pObj);
        Abc_ObjAssignName(pAVar10,pcVar4,"_off");
      }
      else {
        if ((pAVar10->vFanins).nSize == 0) {
          Abc_NtkDupObj(pNtkNew,pObj,0);
          pAVar10 = (pObj->field_6).pCopy;
          if ((pObj->field_0x15 & 4) == 0) {
            pAVar6 = Abc_NtkCreateNodeConst1(pNtkNew);
          }
          else {
            pAVar6 = Abc_NtkCreateNodeConst0(pNtkNew);
          }
          Abc_ObjAddFanin(pAVar10,pAVar6);
          pAVar10 = (pObj->field_6).pCopy;
          pcVar4 = Abc_ObjName(pObj);
          Abc_ObjAssignName(pAVar10,pcVar4,"_on");
          Abc_NtkDupObj(pNtkNew,pObj,0);
          pAVar6 = (pObj->field_6).pCopy;
          if ((pObj->field_0x15 & 4) == 0) {
            pAVar10 = Abc_NtkCreateNodeConst0(pNtkNew);
          }
          else {
            pAVar10 = Abc_NtkCreateNodeConst1(pNtkNew);
          }
          goto LAB_002547a0;
        }
        if ((pObj->vFanins).nSize < 1) {
          __assert_fail("Abc_ObjFaninNum(pObj) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDsd.c"
                        ,0x293,"Abc_Ntk_t *Abc_NtkSparsifyInternal(Abc_Ntk_t *, int, int)");
        }
        uVar9 = 0;
        bVar2 = true;
        do {
          bVar1 = bVar2;
          Cudd_Srandom(0);
          Abc_NtkDupObj(pNtkNew,pAVar10,0);
          nFanins = (pAVar10->vFanins).nSize;
          if (0 < nFanins) {
            lVar8 = 0;
            do {
              Abc_ObjAddFanin((pAVar10->field_6).pCopy,
                              *(Abc_Obj_t **)
                               ((long)pAVar10->pNtk->vObjs->pArray[(pAVar10->vFanins).pArray[lVar8]]
                               + 0x40));
              lVar8 = lVar8 + 1;
              nFanins = (pAVar10->vFanins).nSize;
            } while (lVar8 < nFanins);
          }
          bFunc = (DdNode *)(uVar9 ^ (ulong)(((pAVar10->field_6).pCopy)->field_5).pData);
          n = Abc_NtkSparsifyInternalOne(dd,bFunc,nFanins,nPerc);
          Cudd_Ref(n);
          Cudd_RecursiveDeref(dd,bFunc);
          (((pAVar10->field_6).pCopy)->field_5).pData = n;
          Abc_NtkDupObj(pNtkNew,pObj,0);
          Abc_ObjAddFanin((pObj->field_6).pCopy,(pAVar10->field_6).pCopy);
          pAVar6 = (pObj->field_6).pCopy;
          pcVar4 = Abc_ObjName(pObj);
          pSuffix = "_off";
          if (bVar1) {
            pSuffix = "_on";
          }
          Abc_ObjAssignName(pAVar6,pcVar4,pSuffix);
          uVar9 = 1;
          bVar2 = false;
        } while (bVar1);
      }
      lVar7 = lVar7 + 1;
      pVVar5 = pNtk->vCos;
    } while (lVar7 < pVVar5->nSize);
  }
  Abc_NtkLogicMakeSimpleCos(pNtkNew,0);
  return pNtkNew;
}

Assistant:

Abc_Ntk_t * Abc_NtkSparsifyInternal( Abc_Ntk_t * pNtk, int nPerc, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pDriver, * pFanin;
    DdNode * bFunc, * bFuncOld;
    DdManager * ddNew;
    int i, k, c;
    // start the new network
    pNtkNew = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_BDD, 1 );
    Abc_NtkForEachCi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // make sure the new manager has enough inputs
    ddNew = (DdManager *)pNtkNew->pManFunc;
    Cudd_bddIthVar( ddNew, Abc_NtkCiNum(pNtk)-1 );
    // go through the outputs
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pDriver = Abc_ObjFanin0( pObj );
        if ( Abc_ObjIsCi(pDriver) )
        {
            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjNotCond(pDriver->pCopy, Abc_ObjFaninC0(pObj)) );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), "_on" );

            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjNotCond(pDriver->pCopy, !Abc_ObjFaninC0(pObj)) );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), "_off" );
            continue;
        }
        if ( Abc_ObjFaninNum(pDriver) == 0 )
        {
            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjFaninC0(pObj) ? Abc_NtkCreateNodeConst0(pNtkNew) : Abc_NtkCreateNodeConst1(pNtkNew) );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), "_on" );

            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjFaninC0(pObj) ? Abc_NtkCreateNodeConst1(pNtkNew) : Abc_NtkCreateNodeConst0(pNtkNew) );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), "_off" );
            continue;
        }
        assert( Abc_ObjFaninNum(pObj) > 0 );
        // onset/offset
        for ( c = 0; c < 2; c++ )
        {
            Cudd_Srandom( 0 );
            Abc_NtkDupObj( pNtkNew, pDriver, 0 );
            Abc_ObjForEachFanin( pDriver, pFanin, k )
                Abc_ObjAddFanin( pDriver->pCopy, pFanin->pCopy );
            bFuncOld = Cudd_NotCond( (DdNode *)pDriver->pCopy->pData, c );
            bFunc = Abc_NtkSparsifyInternalOne( ddNew, bFuncOld, Abc_ObjFaninNum(pDriver), nPerc );  Cudd_Ref( bFunc );
            Cudd_RecursiveDeref( ddNew, bFuncOld );
            pDriver->pCopy->pData = bFunc;
            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjAddFanin( pObj->pCopy, pDriver->pCopy );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), (char*)(c ? "_off" : "_on") );
        }
    }
    Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );
    return pNtkNew;
}